

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void set_compound_mode(MACROBLOCK *x,MV_REFERENCE_FRAME ref_frame,MV_REFERENCE_FRAME ref_frame2,
                      int ref_mv_idx,int_mv (*frame_mv) [8],PREDICTION_MODE this_mode)

{
  long lVar1;
  int8_t iVar2;
  int in_ECX;
  char in_DL;
  char in_SIL;
  long in_RDI;
  long in_R8;
  char in_R9B;
  MV_REFERENCE_FRAME ref_frame_comp;
  MB_MODE_INFO *mi;
  MACROBLOCKD *xd;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  lVar1 = **(long **)(in_RDI + 0x2058);
  *(char *)(lVar1 + 0x10) = in_SIL;
  *(char *)(lVar1 + 0x11) = in_DL;
  *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xfdff | 0x200;
  *(ushort *)(lVar1 + 0xa7) = *(ushort *)(lVar1 + 0xa7) & 0xfeff;
  *(undefined1 *)(lVar1 + 0x53) = 0;
  iVar2 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (in_R9B == '\x17') {
    *(undefined4 *)(in_R8 + 0x2e0 + (long)in_SIL * 4) = 0;
    *(undefined4 *)(in_R8 + 0x2e0 + (long)in_DL * 4) = 0;
  }
  else if (in_R9B == '\x11') {
    *(undefined4 *)(in_R8 + 0x220 + (long)in_SIL * 4) =
         *(undefined4 *)(in_RDI + 0x2218 + (long)iVar2 * 0x40);
    *(undefined4 *)(in_R8 + 0x220 + (long)in_DL * 4) =
         *(undefined4 *)(in_RDI + 0x1a0 + (long)iVar2 * 0x40 + 0x207c);
  }
  else if (in_R9B == '\x12') {
    *(undefined4 *)(in_R8 + 0x240 + (long)in_SIL * 4) =
         *(undefined4 *)(in_RDI + 0x2218 + (long)iVar2 * 0x40 + (long)in_ECX * 8);
    *(undefined4 *)(in_R8 + 0x240 + (long)in_DL * 4) =
         *(undefined4 *)(in_RDI + 0x1a0 + (long)iVar2 * 0x40 + 0x207c + (long)in_ECX * 8);
  }
  return;
}

Assistant:

static void set_compound_mode(MACROBLOCK *x, MV_REFERENCE_FRAME ref_frame,
                              MV_REFERENCE_FRAME ref_frame2, int ref_mv_idx,
                              int_mv frame_mv[MB_MODE_COUNT][REF_FRAMES],
                              PREDICTION_MODE this_mode) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  mi->ref_frame[0] = ref_frame;
  mi->ref_frame[1] = ref_frame2;
  mi->compound_idx = 1;
  mi->comp_group_idx = 0;
  mi->interinter_comp.type = COMPOUND_AVERAGE;
  MV_REFERENCE_FRAME ref_frame_comp = av1_ref_frame_type(mi->ref_frame);
  if (this_mode == GLOBAL_GLOBALMV) {
    frame_mv[this_mode][ref_frame].as_int = 0;
    frame_mv[this_mode][ref_frame2].as_int = 0;
  } else if (this_mode == NEAREST_NEARESTMV) {
    frame_mv[this_mode][ref_frame].as_int =
        xd->ref_mv_stack[ref_frame_comp][0].this_mv.as_int;
    frame_mv[this_mode][ref_frame2].as_int =
        xd->ref_mv_stack[ref_frame_comp][0].comp_mv.as_int;
  } else if (this_mode == NEAR_NEARMV) {
    frame_mv[this_mode][ref_frame].as_int =
        xd->ref_mv_stack[ref_frame_comp][ref_mv_idx].this_mv.as_int;
    frame_mv[this_mode][ref_frame2].as_int =
        xd->ref_mv_stack[ref_frame_comp][ref_mv_idx].comp_mv.as_int;
  }
}